

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O2

void sc_core::sc_report_handler::default_handler(sc_report *rep,sc_actions *actions)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  sc_process_b *psVar4;
  sc_report *this;
  sc_report *rep_00;
  sc_report *rep_01;
  string local_40;
  
  uVar1 = *actions;
  if ((uVar1 & 8) != 0) {
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    sc_report_compose_message_abi_cxx11_(&local_40,(sc_core *)rep,rep_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::_M_dispose();
    uVar1 = *actions;
  }
  if (((uVar1 & 4) != 0) && (log_file_name != (char *)0x0)) {
    sc_log_file_handle::update_file_name((sc_log_file_handle *)log_stream,log_file_name);
    sc_time::print(rep->timestamp,(ostream *)(log_stream + 0x20));
    poVar2 = std::operator<<((ostream *)(log_stream + 0x20),": ");
    sc_report_compose_message_abi_cxx11_(&local_40,(sc_core *)rep,rep_01);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::_M_dispose();
    uVar1 = *actions;
  }
  if ((uVar1 & 0x40) != 0) {
    pcVar3 = sc_report::get_msg_type(rep);
    sc_stop_here(pcVar3,rep->severity);
    sc_stop();
    uVar1 = *actions;
  }
  if ((uVar1 & 0x20) != 0) {
    pcVar3 = sc_report::get_msg_type(rep);
    sc_interrupt_here(pcVar3,rep->severity);
    uVar1 = *actions;
  }
  if (-1 < (char)uVar1) {
    if ((uVar1 & 2) == 0) {
      return;
    }
    psVar4 = sc_get_current_process_b();
    if ((psVar4 != (sc_process_b *)0x0) && (psVar4->m_unwinding == true)) {
      psVar4->m_unwinding = false;
    }
    this = (sc_report *)__cxa_allocate_exception(0x50);
    sc_report::sc_report(this,rep);
    __cxa_throw(this,&sc_report::typeinfo,sc_report::~sc_report);
  }
  sc_abort();
}

Assistant:

void sc_report_handler::default_handler(const sc_report& rep,
					const sc_actions& actions)
{
    if ( actions & SC_DISPLAY )
	::std::cout << ::std::endl << sc_report_compose_message(rep) << 
		::std::endl;

    if ( (actions & SC_LOG) && get_log_file_name() )
    {
		log_stream.update_file_name(get_log_file_name());

	*log_stream << rep.get_time() << ": "
	    << sc_report_compose_message(rep) << ::std::endl;
    }
    if ( actions & SC_STOP )
    {
	sc_stop_here(rep.get_msg_type(), rep.get_severity());
	sc_stop();
    }
    if ( actions & SC_INTERRUPT )
	sc_interrupt_here(rep.get_msg_type(), rep.get_severity());

    if ( actions & SC_ABORT )
        sc_abort();

    if ( actions & SC_THROW ) {
        sc_process_b* proc_p = sc_get_current_process_b();
        if( proc_p && proc_p->is_unwinding() )
            proc_p->clear_unwinding();
        throw rep; 
    }
}